

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::allocatePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice device;
  DeviceInterface *vk;
  VkCommandBufferAllocateInfo cmdBufParams;
  VkCommandPoolCreateInfo cmdPoolParams;
  allocator<char> local_b9;
  string local_b8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_98;
  RefBase<vk::VkCommandBuffer_s_*> local_78;
  Handle<(vk::HandleType)24> local_58;
  DeviceInterface *pDStack_50;
  VkCommandPool local_48;
  VkAllocationCallbacks *pVStack_40;
  VkCommandPoolCreateInfo local_38;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_38.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_38.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_38.pNext = (void *)0x0;
  local_38.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_58,vk,device,&local_38,
             (VkAllocationCallbacks *)0x0);
  local_98.m_data.deleter.m_device = (VkDevice)local_48.m_internal;
  local_98.m_data.deleter.m_allocator = pVStack_40;
  local_98.m_data.object.m_internal = local_58.m_internal;
  local_98.m_data.deleter.m_deviceIface = pDStack_50;
  local_58.m_internal = 0;
  pDStack_50 = (DeviceInterface *)0x0;
  local_48.m_internal = 0;
  pVStack_40 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_58);
  local_58.m_internal._0_4_ = 0x28;
  pDStack_50 = (DeviceInterface *)0x0;
  local_48.m_internal = local_98.m_data.object.m_internal;
  pVStack_40 = (VkAllocationCallbacks *)&DAT_100000000;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_b8,vk,device,
             (VkCommandBufferAllocateInfo *)&local_58);
  local_78.m_data.deleter.m_device = (VkDevice)local_b8.field_2._M_allocated_capacity;
  local_78.m_data.deleter.m_pool.m_internal = local_b8.field_2._8_8_;
  local_78.m_data.object = (VkCommandBuffer_s *)local_b8._M_dataplus._M_p;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)local_b8._M_string_length;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity = 0;
  local_b8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Buffer was created correctly.",&local_b9);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_78);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus allocatePrimaryBufferTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// sType;
		DE_NULL,													// pNext;
		*cmdPool,													// commandPool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							// level;
		1u,															// bufferCount;
	};
	const Unique<VkCommandBuffer>			cmdBuf					(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	return tcu::TestStatus::pass("Buffer was created correctly.");
}